

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-intrusive-list.cc
# Opt level: O3

void __thiscall
IntrusiveListIteratorTest_rbegin_rend_backward_Test::TestBody
          (IntrusiveListIteratorTest_rbegin_rend_backward_Test *this)

{
  IntrusiveListIteratorTest *pIVar1;
  unsigned_long uVar2;
  int *lhs;
  TestObject *pTVar3;
  intrusive_list<(anonymous_namespace)::TestObject> *piVar4;
  TestObject *pTVar5;
  unsigned_long uVar6;
  Message local_90;
  undefined1 local_88 [8];
  TestObject *local_80;
  TestObject *local_78;
  int *local_70;
  IntrusiveListIteratorTest_rbegin_rend_backward_Test *local_68;
  unsigned_long local_60;
  AssertHelper local_58;
  reverse_iterator<wabt::intrusive_list<(anonymous_namespace)::TestObject>::const_iterator> local_50
  ;
  TestObjectList *local_40;
  undefined8 local_38;
  
  pTVar5 = (this->super_IntrusiveListIteratorTest).list_.first_;
  local_68 = this;
  lhs = (int *)operator_new(0xc);
  lhs[0] = 1;
  lhs[1] = 2;
  lhs[2] = 3;
  local_60 = 0;
  local_70 = lhs;
  if (pTVar5 != (TestObject *)0x0) {
    pIVar1 = &local_68->super_IntrusiveListIteratorTest;
    uVar2 = 1;
    do {
      uVar6 = uVar2;
      pTVar5 = (pTVar5->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_;
      pTVar3 = pTVar5;
      if (pTVar5 == (TestObject *)0x0) {
        pTVar3 = (TestObject *)&pIVar1->list_;
      }
      if (((TestObjectList *)pTVar3)->last_ == (TestObject *)0x0) {
        __assert_fail("node_",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/intrusive-list.h"
                      ,0x9e,
                      "pointer wabt::intrusive_list<(anonymous namespace)::TestObject>::iterator::operator->() const [T = (anonymous namespace)::TestObject]"
                     );
      }
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_88,"expected[count]","last->data",lhs,
                 &((TestObjectList *)pTVar3)->last_->data);
      if (local_88[0] == (internal)0x0) {
        testing::Message::Message(&local_90);
        if (local_80 == (TestObject *)0x0) {
          pTVar5 = (TestObject *)0x1ee0e1;
        }
        else {
          pTVar5 = (local_80->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_58,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/test-intrusive-list.cc"
                   ,0xad,(char *)pTVar5);
        testing::internal::AssertHelper::operator=(&local_58,&local_90);
        testing::internal::AssertHelper::~AssertHelper(&local_58);
        if (local_90.ss_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl !=
            (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
             )0x0) {
          (**(code **)(*(long *)local_90.ss_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl + 8))();
        }
        if (local_80 != (TestObject *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_80,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80
                      );
        }
        goto LAB_00149d8a;
      }
      if (local_80 != (TestObject *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_80,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80);
      }
      lhs = lhs + 1;
      uVar2 = uVar6 + 1;
      local_60 = uVar6;
    } while (pTVar5 != (TestObject *)0x0);
  }
  local_90.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )0x3;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_88,"count","expected.size()",&local_60,(unsigned_long *)&local_90);
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message(&local_90);
    if (local_80 == (TestObject *)0x0) {
      pTVar5 = (TestObject *)0x1ee0e1;
    }
    else {
      pTVar5 = (local_80->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/test-intrusive-list.cc"
               ,0xb0,(char *)pTVar5);
    testing::internal::AssertHelper::operator=(&local_58,&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if (local_90.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )0x0) {
      (**(code **)(*(long *)local_90.ss_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  if (local_80 != (TestObject *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_80,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80);
  }
LAB_00149d8a:
  operator_delete(local_70,0xc);
  local_50.current.list_ = (local_68->super_IntrusiveListIteratorTest).clist_;
  local_38 = 0;
  pTVar5 = (local_50.current.list_)->first_;
  local_50.current.node_ = pTVar5;
  local_40 = local_50.current.list_;
  piVar4 = (intrusive_list<(anonymous_namespace)::TestObject> *)operator_new(0xc);
  local_80 = (TestObject *)((long)&piVar4->last_ + 4);
  piVar4->first_ = (TestObject *)0x200000001;
  *(undefined4 *)&piVar4->last_ = 3;
  local_88 = (undefined1  [8])piVar4;
  local_78 = local_80;
  (anonymous_namespace)::IntrusiveListIteratorTest::
  TestBackward<std::reverse_iterator<wabt::intrusive_list<(anonymous_namespace)::TestObject>::const_iterator>>
            ((IntrusiveListIteratorTest *)&local_40,&local_50,
             (reverse_iterator<wabt::intrusive_list<(anonymous_namespace)::TestObject>::const_iterator>
              *)local_88,(vector<int,_std::allocator<int>_> *)pTVar5);
  operator_delete(piVar4,0xc);
  return;
}

Assistant:

TEST_F(IntrusiveListIteratorTest, rbegin_rend_backward) {
  TestBackward(list_.rbegin(), list_.rend(), {1, 2, 3});
  TestBackward(clist_.rbegin(), clist_.rend(), {1, 2, 3});
}